

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMiIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  uint uVar1;
  uint uVar2;
  float *pfVar3;
  Ref<embree::Geometry> *pRVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [12];
  vfloat<4> vVar19;
  bool bVar20;
  undefined4 uVar21;
  int iVar22;
  float *vertices;
  ulong uVar23;
  Scene *pSVar24;
  RTCIntersectArguments *pRVar25;
  OccludedFunc4 p_Var26;
  OccludedFunc4 p_Var27;
  size_t i_1;
  long lVar28;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar29;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar30;
  size_t sVar31;
  uint uVar32;
  size_t sVar34;
  NodeRef *pNVar35;
  NodeRef root;
  long lVar36;
  ulong uVar37;
  float fVar38;
  float fVar55;
  float fVar56;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar57;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar58;
  float fVar69;
  float fVar70;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar71;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float fVar72;
  float fVar75;
  float fVar76;
  undefined1 auVar73 [16];
  float fVar77;
  undefined1 auVar74 [16];
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar85;
  float fVar88;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar86;
  float fVar87;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar94;
  float fVar97;
  float fVar98;
  undefined1 auVar95 [16];
  float fVar99;
  undefined1 auVar96 [16];
  float fVar100;
  float fVar101;
  float fVar106;
  float fVar108;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  float fVar107;
  float fVar109;
  float fVar110;
  float fVar111;
  uint uVar112;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  float fVar118;
  float fVar123;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar122 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  float fVar126;
  float fVar129;
  float fVar130;
  float fVar131;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  float fVar132;
  float fVar133;
  uint uVar136;
  float fVar137;
  float fVar138;
  uint uVar139;
  float fVar140;
  float fVar141;
  uint uVar142;
  float fVar143;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  uint uVar144;
  float fVar145;
  uint uVar146;
  float fVar147;
  uint uVar148;
  float fVar149;
  uint uVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar167;
  float fVar168;
  float fVar169;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  Precalculations pre;
  float local_1ab8;
  float fStack_1ab4;
  float fStack_1ab0;
  float fStack_1aac;
  vbool<4> terminated;
  RTCFilterFunctionNArguments args;
  float local_1a28;
  float fStack_1a24;
  float fStack_1a20;
  undefined1 local_1a08 [16];
  BVH *local_19f0;
  Intersectors *local_19e8;
  OccludedFunc4 local_19e0;
  Scene *local_19d8;
  vuint<4> *v;
  TravRayK<4,_true> tray;
  undefined1 local_18e8 [16];
  undefined1 local_18d8 [16];
  undefined1 local_18c8 [16];
  float local_18b8;
  float fStack_18b4;
  float fStack_18b0;
  float fStack_18ac;
  undefined1 local_18a8 [16];
  undefined8 local_1898;
  undefined8 uStack_1890;
  undefined8 local_1888;
  undefined8 uStack_1880;
  undefined8 uStack_1840;
  longlong local_17e8;
  longlong lStack_17e0;
  longlong local_17d8;
  longlong lStack_17d0;
  anon_union_48_2_4062524c_for_Vec3<embree::vfloat_impl<4>_>_1 local_17c8;
  undefined8 local_1798;
  undefined8 uStack_1790;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1788;
  undefined1 local_1778 [16];
  uint local_1768;
  uint uStack_1764;
  uint uStack_1760;
  uint uStack_175c;
  uint local_1758;
  uint uStack_1754;
  uint uStack_1750;
  uint uStack_174c;
  uint local_1748;
  uint uStack_1744;
  uint uStack_1740;
  uint uStack_173c;
  vfloat<4> t;
  vfloat<4> v_1;
  vfloat<4> u;
  Vec3vf<4> Ng;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  Intersectors *pIVar33;
  undefined1 auVar121 [16];
  
  local_19f0 = (BVH *)This->ptr;
  uVar23 = (local_19f0->root).ptr;
  if (uVar23 != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar48._8_4_ = 0xffffffff;
    auVar48._0_8_ = 0xffffffffffffffff;
    auVar48._12_4_ = 0xffffffff;
    auVar113 = *(undefined1 (*) [16])(ray + 0x80);
    auVar165._0_12_ = ZEXT812(0);
    auVar165._12_4_ = 0;
    uVar144 = -(uint)(0.0 <= auVar113._0_4_ && (valid_i->field_0).i[0] == -1);
    uVar146 = -(uint)(0.0 <= auVar113._4_4_ && (valid_i->field_0).i[1] == -1);
    uVar148 = -(uint)(0.0 <= auVar113._8_4_ && (valid_i->field_0).i[2] == -1);
    uVar150 = -(uint)(0.0 <= auVar113._12_4_ && (valid_i->field_0).i[3] == -1);
    auVar59._4_4_ = uVar146;
    auVar59._0_4_ = uVar144;
    auVar59._8_4_ = uVar148;
    auVar59._12_4_ = uVar150;
    uVar32 = movmskps((int)valid_i,auVar59);
    pIVar33 = (Intersectors *)(ulong)uVar32;
    if (uVar32 != 0) {
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      uVar32 = (uint)DAT_01f46710;
      uVar136 = DAT_01f46710._4_4_;
      uVar139 = DAT_01f46710._8_4_;
      uVar142 = DAT_01f46710._12_4_;
      auVar124 = divps(_DAT_01f46a60,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar128._4_4_ = -(uint)((float)(tray.dir.field_0._4_4_ & uVar136) < 1e-18);
      auVar128._0_4_ = -(uint)((float)(tray.dir.field_0._0_4_ & uVar32) < 1e-18);
      auVar128._8_4_ = -(uint)((float)(tray.dir.field_0._8_4_ & uVar139) < 1e-18);
      auVar128._12_4_ = -(uint)((float)(tray.dir.field_0._12_4_ & uVar142) < 1e-18);
      auVar81 = divps(_DAT_01f46a60,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar135._4_4_ = -(uint)((float)(tray.dir.field_0._20_4_ & uVar136) < 1e-18);
      auVar135._0_4_ = -(uint)((float)(tray.dir.field_0._16_4_ & uVar32) < 1e-18);
      auVar59 = divps(_DAT_01f46a60,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      tray.rdir.field_0.field_0.x.field_0 =
           (vfloat_impl<4>)blendvps(auVar124,_DAT_01f76a70,auVar128);
      auVar135._8_4_ = -(uint)((float)(tray.dir.field_0._24_4_ & uVar139) < 1e-18);
      auVar135._12_4_ = -(uint)((float)(tray.dir.field_0._28_4_ & uVar142) < 1e-18);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)blendvps(auVar81,_DAT_01f76a70,auVar135)
      ;
      auVar81._4_4_ = -(uint)((float)(tray.dir.field_0._36_4_ & uVar136) < 1e-18);
      auVar81._0_4_ = -(uint)((float)(tray.dir.field_0._32_4_ & uVar32) < 1e-18);
      auVar81._8_4_ = -(uint)((float)(tray.dir.field_0._40_4_ & uVar139) < 1e-18);
      auVar81._12_4_ = -(uint)((float)(tray.dir.field_0._44_4_ & uVar142) < 1e-18);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)blendvps(auVar59,_DAT_01f76a70,auVar81);
      tray.nearXYZ.field_0._0_8_ =
           CONCAT44(-(uint)(tray.rdir.field_0._4_4_ < 0.0),-(uint)(tray.rdir.field_0._0_4_ < 0.0)) &
           0x1000000010;
      tray.nearXYZ.field_0._8_4_ = -(uint)(tray.rdir.field_0._8_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._12_4_ = -(uint)(tray.rdir.field_0._12_4_ < 0.0) & 0x10;
      auVar124._4_4_ = -(uint)(0.0 <= tray.rdir.field_0._20_4_);
      auVar124._0_4_ = -(uint)(0.0 <= tray.rdir.field_0._16_4_);
      auVar124._8_4_ = -(uint)(0.0 <= tray.rdir.field_0._24_4_);
      auVar124._12_4_ = -(uint)(0.0 <= tray.rdir.field_0._28_4_);
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)blendvps(_DAT_01f79fd0,_DAT_01f57210,auVar124);
      auVar39._4_4_ = -(uint)(0.0 <= tray.rdir.field_0._36_4_);
      auVar39._0_4_ = -(uint)(0.0 <= tray.rdir.field_0._32_4_);
      auVar39._8_4_ = -(uint)(0.0 <= tray.rdir.field_0._40_4_);
      auVar39._12_4_ = -(uint)(0.0 <= tray.rdir.field_0._44_4_);
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)blendvps(_DAT_01f79ff0,_DAT_01f79fe0,auVar39);
      auVar59 = maxps(*(undefined1 (*) [16])(ray + 0x30),auVar165);
      auVar113 = maxps(auVar113,auVar165);
      fVar151 = (float)DAT_01f45a30;
      fVar154 = DAT_01f45a30._4_4_;
      fVar157 = DAT_01f45a30._8_4_;
      fVar160 = DAT_01f45a30._12_4_;
      auVar40._4_4_ = uVar146;
      auVar40._0_4_ = uVar144;
      auVar40._8_4_ = uVar148;
      auVar40._12_4_ = uVar150;
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           blendvps((undefined1  [16])_DAT_01f45a30,auVar59,auVar40);
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)blendvps(_DAT_01f45a40,auVar113,auVar40);
      auVar113._4_4_ = uVar146;
      auVar113._0_4_ = uVar144;
      auVar113._8_4_ = uVar148;
      auVar113._12_4_ = uVar150;
      terminated.field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar48 ^ auVar113);
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar32 = 3;
        p_Var26 = (OccludedFunc4)0x0;
      }
      else {
        p_Var26 = (OccludedFunc4)
                  (CONCAT71((int7)((ulong)context->args >> 8),
                            *(byte *)((long)&context->args->flags + 2)) & 0xffffffffffffff01);
        uVar32 = ((char)p_Var26 == '\0') + 2;
      }
      pNVar35 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_near[0].field_0 = _DAT_01f45a30;
      stack_node[1].ptr = uVar23;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      paVar29 = &stack_near[2].field_0;
      local_19e8 = This;
LAB_006c07fc:
      do {
        do {
          root.ptr = pNVar35[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_006c1570;
          pNVar35 = pNVar35 + -1;
          paVar30 = paVar29 + -1;
          local_1ab8 = paVar30->v[0];
          fStack_1ab4 = *(float *)((long)paVar29 + -0xc);
          fStack_1ab0 = *(float *)((long)paVar29 + -8);
          fStack_1aac = *(float *)((long)paVar29 + -4);
          vVar19.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar30->v;
          auVar41._4_4_ = -(uint)(fStack_1ab4 < tray.tfar.field_0.v[1]);
          auVar41._0_4_ = -(uint)(local_1ab8 < tray.tfar.field_0.v[0]);
          auVar41._8_4_ = -(uint)(fStack_1ab0 < tray.tfar.field_0.v[2]);
          auVar41._12_4_ = -(uint)(fStack_1aac < tray.tfar.field_0.v[3]);
          uVar136 = movmskps((int)uVar23,auVar41);
          uVar23 = (ulong)uVar136;
          paVar29 = paVar30;
        } while (uVar136 == 0);
        uVar37 = (ulong)(byte)uVar136;
        if (uVar32 < (uint)POPCOUNT(uVar136 & 0xff)) {
LAB_006c083e:
          do {
            if ((root.ptr & 8) != 0) {
              pIVar33 = (Intersectors *)&args;
              if (root.ptr == 0xfffffffffffffff8) goto LAB_006c1570;
              auVar46._4_4_ = -(uint)(fStack_1ab4 < tray.tfar.field_0.v[1]);
              auVar46._0_4_ = -(uint)(local_1ab8 < tray.tfar.field_0.v[0]);
              auVar46._8_4_ = -(uint)(fStack_1ab0 < tray.tfar.field_0.v[2]);
              auVar46._12_4_ = -(uint)(fStack_1aac < tray.tfar.field_0.v[3]);
              uVar136 = movmskps((int)uVar23,auVar46);
              uVar23 = (ulong)uVar136;
              paVar29 = paVar30;
              if (uVar136 == 0) goto LAB_006c07fc;
              auVar113 = (undefined1  [16])terminated.field_0 ^ _DAT_01f46b70;
              lVar36 = (root.ptr & 0xfffffffffffffff0) + 0x40;
              p_Var27 = (OccludedFunc4)0x0;
              goto LAB_006c0a35;
            }
            sVar34 = 8;
            local_1ab8 = fVar151;
            fStack_1ab4 = fVar154;
            fStack_1ab0 = fVar157;
            fStack_1aac = fVar160;
            for (p_Var26 = (OccludedFunc4)0x0;
                (p_Var26 != (OccludedFunc4)&DAT_00000004 &&
                (sVar31 = *(size_t *)((root.ptr & 0xfffffffffffffff0) + (long)p_Var26 * 8),
                sVar31 != 8)); p_Var26 = p_Var26 + 1) {
              fVar77 = *(float *)(root.ptr + 0x20 + (long)p_Var26 * 4);
              fVar91 = *(float *)(root.ptr + 0x30 + (long)p_Var26 * 4);
              fVar99 = *(float *)(root.ptr + 0x40 + (long)p_Var26 * 4);
              fVar57 = *(float *)(root.ptr + 0x50 + (long)p_Var26 * 4);
              auVar60._0_8_ =
                   CONCAT44((fVar77 - (float)tray.org.field_0._4_4_) * tray.rdir.field_0._4_4_,
                            (fVar77 - (float)tray.org.field_0._0_4_) * tray.rdir.field_0._0_4_);
              auVar60._8_4_ = (fVar77 - (float)tray.org.field_0._8_4_) * tray.rdir.field_0._8_4_;
              auVar60._12_4_ = (fVar77 - (float)tray.org.field_0._12_4_) * tray.rdir.field_0._12_4_;
              auVar42._0_8_ =
                   CONCAT44((fVar99 - (float)tray.org.field_0._20_4_) * tray.rdir.field_0._20_4_,
                            (fVar99 - (float)tray.org.field_0._16_4_) * tray.rdir.field_0._16_4_);
              auVar42._8_4_ = (fVar99 - (float)tray.org.field_0._24_4_) * tray.rdir.field_0._24_4_;
              auVar42._12_4_ = (fVar99 - (float)tray.org.field_0._28_4_) * tray.rdir.field_0._28_4_;
              fVar77 = *(float *)(root.ptr + 0x60 + (long)p_Var26 * 4);
              auVar95._0_8_ =
                   CONCAT44((fVar77 - (float)tray.org.field_0._36_4_) * tray.rdir.field_0._36_4_,
                            (fVar77 - (float)tray.org.field_0._32_4_) * tray.rdir.field_0._32_4_);
              auVar95._8_4_ = (fVar77 - (float)tray.org.field_0._40_4_) * tray.rdir.field_0._40_4_;
              auVar95._12_4_ = (fVar77 - (float)tray.org.field_0._44_4_) * tray.rdir.field_0._44_4_;
              auVar73._0_4_ = (fVar91 - (float)tray.org.field_0._0_4_) * tray.rdir.field_0._0_4_;
              auVar73._4_4_ = (fVar91 - (float)tray.org.field_0._4_4_) * tray.rdir.field_0._4_4_;
              auVar73._8_4_ = (fVar91 - (float)tray.org.field_0._8_4_) * tray.rdir.field_0._8_4_;
              auVar73._12_4_ = (fVar91 - (float)tray.org.field_0._12_4_) * tray.rdir.field_0._12_4_;
              auVar82._0_4_ = (fVar57 - (float)tray.org.field_0._16_4_) * tray.rdir.field_0._16_4_;
              auVar82._4_4_ = (fVar57 - (float)tray.org.field_0._20_4_) * tray.rdir.field_0._20_4_;
              auVar82._8_4_ = (fVar57 - (float)tray.org.field_0._24_4_) * tray.rdir.field_0._24_4_;
              auVar82._12_4_ = (fVar57 - (float)tray.org.field_0._28_4_) * tray.rdir.field_0._28_4_;
              fVar77 = *(float *)(root.ptr + 0x70 + (long)p_Var26 * 4);
              auVar114._0_4_ = (fVar77 - (float)tray.org.field_0._32_4_) * tray.rdir.field_0._32_4_;
              auVar114._4_4_ = (fVar77 - (float)tray.org.field_0._36_4_) * tray.rdir.field_0._36_4_;
              auVar114._8_4_ = (fVar77 - (float)tray.org.field_0._40_4_) * tray.rdir.field_0._40_4_;
              auVar114._12_4_ = (fVar77 - (float)tray.org.field_0._44_4_) * tray.rdir.field_0._44_4_
              ;
              auVar102._8_4_ = auVar60._8_4_;
              auVar102._0_8_ = auVar60._0_8_;
              auVar102._12_4_ = auVar60._12_4_;
              auVar113 = minps(auVar102,auVar73);
              auVar119._8_4_ = auVar42._8_4_;
              auVar119._0_8_ = auVar42._0_8_;
              auVar119._12_4_ = auVar42._12_4_;
              auVar59 = minps(auVar119,auVar82);
              auVar113 = maxps(auVar113,auVar59);
              auVar120._8_4_ = auVar95._8_4_;
              auVar120._0_8_ = auVar95._0_8_;
              auVar120._12_4_ = auVar95._12_4_;
              auVar59 = minps(auVar120,auVar114);
              auVar113 = maxps(auVar113,auVar59);
              auVar103._0_8_ = CONCAT44(auVar113._4_4_ * 0.99999964,auVar113._0_4_ * 0.99999964);
              auVar103._8_4_ = auVar113._8_4_ * 0.99999964;
              auVar103._12_4_ = auVar113._12_4_ * 0.99999964;
              auVar59 = maxps(auVar60,auVar73);
              auVar113 = maxps(auVar42,auVar82);
              auVar113 = minps(auVar59,auVar113);
              auVar59 = maxps(auVar95,auVar114);
              auVar113 = minps(auVar113,auVar59);
              auVar61._0_4_ = auVar113._0_4_ * 1.0000004;
              auVar61._4_4_ = auVar113._4_4_ * 1.0000004;
              auVar61._8_4_ = auVar113._8_4_ * 1.0000004;
              auVar61._12_4_ = auVar113._12_4_ * 1.0000004;
              auVar43._8_4_ = auVar103._8_4_;
              auVar43._0_8_ = auVar103._0_8_;
              auVar43._12_4_ = auVar103._12_4_;
              auVar113 = maxps(auVar43,(undefined1  [16])tray.tnear.field_0);
              auVar59 = minps(auVar61,(undefined1  [16])tray.tfar.field_0);
              auVar44._4_4_ = -(uint)(auVar113._4_4_ <= auVar59._4_4_);
              auVar44._0_4_ = -(uint)(auVar113._0_4_ <= auVar59._0_4_);
              auVar44._8_4_ = -(uint)(auVar113._8_4_ <= auVar59._8_4_);
              auVar44._12_4_ = -(uint)(auVar113._12_4_ <= auVar59._12_4_);
              uVar136 = movmskps((int)pIVar33,auVar44);
              pIVar33 = (Intersectors *)(ulong)uVar136;
              if (uVar136 == 0) {
                auVar63._4_4_ = fStack_1ab4;
                auVar63._0_4_ = local_1ab8;
                auVar63._8_4_ = fStack_1ab0;
                auVar63._12_4_ = fStack_1aac;
                sVar31 = sVar34;
              }
              else {
                auVar62._4_4_ = fVar154;
                auVar62._0_4_ = fVar151;
                auVar62._8_4_ = fVar157;
                auVar62._12_4_ = fVar160;
                auVar63 = blendvps(auVar62,auVar103,auVar44);
                if (sVar34 != 8) {
                  pNVar35->ptr = sVar34;
                  pNVar35 = pNVar35 + 1;
                  paVar30->v[0] = local_1ab8;
                  paVar30->v[1] = fStack_1ab4;
                  paVar30->v[2] = fStack_1ab0;
                  paVar30->v[3] = fStack_1aac;
                  paVar30 = paVar30 + 1;
                }
              }
              local_1ab8 = auVar63._0_4_;
              fStack_1ab4 = auVar63._4_4_;
              fStack_1ab0 = auVar63._8_4_;
              fStack_1aac = auVar63._12_4_;
              sVar34 = sVar31;
            }
            if (sVar34 == 8) goto LAB_006c09ce;
            auVar45._4_4_ = -(uint)(fStack_1ab4 < tray.tfar.field_0.v[1]);
            auVar45._0_4_ = -(uint)(local_1ab8 < tray.tfar.field_0.v[0]);
            auVar45._8_4_ = -(uint)(fStack_1ab0 < tray.tfar.field_0.v[2]);
            auVar45._12_4_ = -(uint)(fStack_1aac < tray.tfar.field_0.v[3]);
            uVar21 = movmskps((int)(root.ptr & 0xfffffffffffffff0),auVar45);
            uVar23 = (ulong)(uint)POPCOUNT(uVar21);
            root.ptr = sVar34;
          } while ((byte)uVar32 < (byte)POPCOUNT(uVar21));
          pNVar35->ptr = sVar34;
          pNVar35 = pNVar35 + 1;
          paVar30->v[0] = local_1ab8;
          paVar30->v[1] = fStack_1ab4;
          paVar30->v[2] = fStack_1ab0;
          paVar30->v[3] = fStack_1aac;
          paVar30 = paVar30 + 1;
LAB_006c09ce:
          uVar23 = 4;
        }
        else {
          while (uVar37 != 0) {
            p_Var27 = (OccludedFunc4)0x0;
            if (uVar37 != 0) {
              for (; (uVar37 >> (long)p_Var27 & 1) == 0; p_Var27 = p_Var27 + 1) {
              }
            }
            uVar37 = uVar37 & uVar37 - 1;
            p_Var26 = p_Var27;
            pIVar33 = local_19e8;
            bVar20 = occluded1(local_19e8,local_19f0,root,(size_t)p_Var27,&pre,ray,&tray,context);
            if (bVar20) {
              terminated.field_0.i[(long)p_Var27] = -1;
            }
          }
          uVar139 = movmskps((int)p_Var26,(undefined1  [16])terminated.field_0);
          p_Var26 = (OccludedFunc4)(ulong)uVar139;
          uVar23 = 3;
          fVar151 = INFINITY;
          fVar154 = INFINITY;
          fVar157 = INFINITY;
          fVar160 = INFINITY;
          local_1ab8 = vVar19.field_0._0_4_;
          fStack_1ab4 = vVar19.field_0._4_4_;
          fStack_1ab0 = vVar19.field_0._8_4_;
          fStack_1aac = vVar19.field_0._12_4_;
          if (uVar139 != 0xf) {
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01f45a40,
                          (undefined1  [16])terminated.field_0);
            uVar23 = 2;
          }
          if (uVar32 < (uint)POPCOUNT(uVar136 & 0xff)) goto LAB_006c083e;
        }
        paVar29 = paVar30;
      } while (((int)uVar23 == 4) || ((int)uVar23 == 2));
LAB_006c1570:
      auVar54._4_4_ = uVar146 & terminated.field_0.i[1];
      auVar54._0_4_ = uVar144 & terminated.field_0.i[0];
      auVar54._8_4_ = uVar148 & terminated.field_0.i[2];
      auVar54._12_4_ = uVar150 & terminated.field_0.i[3];
      auVar113 = blendvps(*(undefined1 (*) [16])(ray + 0x80),_DAT_01f45a40,auVar54);
      *(undefined1 (*) [16])(ray + 0x80) = auVar113;
    }
  }
  return;
LAB_006c0a35:
  do {
    if (p_Var27 == (OccludedFunc4)((ulong)((uint)root.ptr & 0xf) - 8)) break;
    v = (vuint<4> *)((long)p_Var27 * 0x50 + (root.ptr & 0xfffffffffffffff0));
    pSVar24 = context->scene;
    lVar28 = 0;
    auVar59 = auVar113;
    local_19e0 = p_Var27;
    local_19d8 = pSVar24;
    do {
      uVar21 = SUB84(pSVar24,0);
      if ((lVar28 == 4) || (*(int *)(lVar36 + lVar28 * 4) == -1)) goto LAB_006c1449;
      pfVar3 = (local_19d8->vertices).items[*(uint *)(lVar36 + -0x10 + lVar28 * 4)];
      uVar23 = (ulong)*(uint *)(lVar36 + -0x40 + lVar28 * 4);
      uVar37 = (ulong)*(uint *)(lVar36 + -0x30 + lVar28 * 4);
      fVar151 = pfVar3[uVar23];
      fVar154 = pfVar3[uVar23 + 1];
      fVar157 = pfVar3[uVar23 + 2];
      fVar160 = pfVar3[uVar37];
      fVar77 = pfVar3[uVar37 + 1];
      fVar91 = pfVar3[uVar37 + 2];
      uVar23 = (ulong)*(uint *)(lVar36 + -0x20 + lVar28 * 4);
      fVar99 = pfVar3[uVar23];
      fVar57 = pfVar3[uVar23 + 1];
      fVar71 = pfVar3[uVar23 + 2];
      local_17d8 = v[3].field_0.v[0];
      lStack_17d0 = v[3].field_0.v[1];
      local_17e8 = v[4].field_0.v[0];
      lStack_17e0 = v[4].field_0.v[1];
      fVar94 = *(float *)ray;
      fVar97 = *(float *)(ray + 4);
      fVar98 = *(float *)(ray + 8);
      fVar9 = *(float *)(ray + 0xc);
      fVar38 = *(float *)(ray + 0x10);
      fVar55 = *(float *)(ray + 0x14);
      fVar56 = *(float *)(ray + 0x18);
      fVar10 = *(float *)(ray + 0x1c);
      fVar58 = *(float *)(ray + 0x20);
      fVar69 = *(float *)(ray + 0x24);
      fVar70 = *(float *)(ray + 0x28);
      fVar11 = *(float *)(ray + 0x2c);
      fVar177 = fVar151 - fVar94;
      fVar178 = fVar151 - fVar97;
      fVar179 = fVar151 - fVar98;
      fVar151 = fVar151 - fVar9;
      fVar132 = fVar154 - fVar38;
      fVar137 = fVar154 - fVar55;
      fVar140 = fVar154 - fVar56;
      fVar154 = fVar154 - fVar10;
      fVar145 = fVar157 - fVar58;
      fVar147 = fVar157 - fVar69;
      fVar149 = fVar157 - fVar70;
      fVar157 = fVar157 - fVar11;
      fVar170 = fVar160 - fVar94;
      fVar172 = fVar160 - fVar97;
      fVar174 = fVar160 - fVar98;
      fVar160 = fVar160 - fVar9;
      fVar72 = fVar77 - fVar38;
      fVar75 = fVar77 - fVar55;
      fVar76 = fVar77 - fVar56;
      fVar77 = fVar77 - fVar10;
      fVar78 = fVar91 - fVar58;
      fVar85 = fVar91 - fVar69;
      fVar88 = fVar91 - fVar70;
      fVar91 = fVar91 - fVar11;
      fVar94 = fVar99 - fVar94;
      fVar97 = fVar99 - fVar97;
      fVar98 = fVar99 - fVar98;
      fVar99 = fVar99 - fVar9;
      fVar38 = fVar57 - fVar38;
      fVar55 = fVar57 - fVar55;
      fVar56 = fVar57 - fVar56;
      fVar57 = fVar57 - fVar10;
      fVar58 = fVar71 - fVar58;
      fVar69 = fVar71 - fVar69;
      fVar70 = fVar71 - fVar70;
      fVar71 = fVar71 - fVar11;
      fVar79 = fVar94 - fVar177;
      fVar86 = fVar97 - fVar178;
      fVar89 = fVar98 - fVar179;
      fVar92 = fVar99 - fVar151;
      fVar163 = fVar38 - fVar132;
      fVar167 = fVar55 - fVar137;
      fVar168 = fVar56 - fVar140;
      fVar169 = fVar57 - fVar154;
      fVar152 = fVar58 - fVar145;
      fVar155 = fVar69 - fVar147;
      fVar158 = fVar70 - fVar149;
      fVar161 = fVar71 - fVar157;
      auVar18 = *(undefined1 (*) [12])(ray + 0x60);
      fVar9 = *(float *)(ray + 0x6c);
      fVar10 = *(float *)(ray + 0x50);
      fVar11 = *(float *)(ray + 0x54);
      fVar12 = *(float *)(ray + 0x58);
      fVar13 = *(float *)(ray + 0x5c);
      fVar14 = *(float *)(ray + 0x40);
      fVar15 = *(float *)(ray + 0x44);
      fVar16 = *(float *)(ray + 0x48);
      fVar17 = *(float *)(ray + 0x4c);
      fVar118 = (fVar163 * (fVar58 + fVar145) - (fVar38 + fVar132) * fVar152) * fVar14 +
                ((fVar94 + fVar177) * fVar152 - (fVar58 + fVar145) * fVar79) * fVar10 +
                (fVar79 * (fVar38 + fVar132) - (fVar94 + fVar177) * fVar163) *
                *(float *)(ray + 0x60);
      fVar123 = (fVar167 * (fVar69 + fVar147) - (fVar55 + fVar137) * fVar155) * fVar15 +
                ((fVar97 + fVar178) * fVar155 - (fVar69 + fVar147) * fVar86) * fVar11 +
                (fVar86 * (fVar55 + fVar137) - (fVar97 + fVar178) * fVar167) * *(float *)(ray + 100)
      ;
      auVar121._0_8_ = CONCAT44(fVar123,fVar118);
      auVar121._8_4_ =
           (fVar168 * (fVar70 + fVar149) - (fVar56 + fVar140) * fVar158) * fVar16 +
           ((fVar98 + fVar179) * fVar158 - (fVar70 + fVar149) * fVar89) * fVar12 +
           (fVar89 * (fVar56 + fVar140) - (fVar98 + fVar179) * fVar168) * *(float *)(ray + 0x68);
      auVar121._12_4_ =
           (fVar169 * (fVar71 + fVar157) - (fVar57 + fVar154) * fVar161) * fVar17 +
           ((fVar99 + fVar151) * fVar161 - (fVar71 + fVar157) * fVar92) * fVar13 +
           (fVar92 * (fVar57 + fVar154) - (fVar99 + fVar151) * fVar169) * fVar9;
      fVar80 = fVar177 - fVar170;
      fVar87 = fVar178 - fVar172;
      fVar90 = fVar179 - fVar174;
      fVar93 = fVar151 - fVar160;
      fVar126 = fVar132 - fVar72;
      fVar129 = fVar137 - fVar75;
      fVar130 = fVar140 - fVar76;
      fVar131 = fVar154 - fVar77;
      fVar100 = fVar145 - fVar78;
      fVar106 = fVar147 - fVar85;
      fVar108 = fVar149 - fVar88;
      fVar110 = fVar157 - fVar91;
      local_1a28 = auVar18._0_4_;
      fStack_1a24 = auVar18._4_4_;
      fStack_1a20 = auVar18._8_4_;
      fVar153 = (fVar126 * (fVar145 + fVar78) - (fVar132 + fVar72) * fVar100) * fVar14 +
                ((fVar177 + fVar170) * fVar100 - (fVar145 + fVar78) * fVar80) * fVar10 +
                (fVar80 * (fVar132 + fVar72) - (fVar177 + fVar170) * fVar126) * local_1a28;
      fVar156 = (fVar129 * (fVar147 + fVar85) - (fVar137 + fVar75) * fVar106) * fVar15 +
                ((fVar178 + fVar172) * fVar106 - (fVar147 + fVar85) * fVar87) * fVar11 +
                (fVar87 * (fVar137 + fVar75) - (fVar178 + fVar172) * fVar129) * fStack_1a24;
      fVar159 = (fVar130 * (fVar149 + fVar88) - (fVar140 + fVar76) * fVar108) * fVar16 +
                ((fVar179 + fVar174) * fVar108 - (fVar149 + fVar88) * fVar90) * fVar12 +
                (fVar90 * (fVar140 + fVar76) - (fVar179 + fVar174) * fVar130) * fStack_1a20;
      fVar162 = (fVar131 * (fVar157 + fVar91) - (fVar154 + fVar77) * fVar110) * fVar17 +
                ((fVar151 + fVar160) * fVar110 - (fVar157 + fVar91) * fVar93) * fVar13 +
                (fVar93 * (fVar154 + fVar77) - (fVar151 + fVar160) * fVar131) * fVar9;
      fVar133 = fVar170 - fVar94;
      fVar138 = fVar172 - fVar97;
      fVar141 = fVar174 - fVar98;
      fVar143 = fVar160 - fVar99;
      fVar101 = fVar72 - fVar38;
      fVar107 = fVar75 - fVar55;
      fVar109 = fVar76 - fVar56;
      fVar111 = fVar77 - fVar57;
      fVar171 = fVar78 - fVar58;
      fVar173 = fVar85 - fVar69;
      fVar175 = fVar88 - fVar70;
      fVar176 = fVar91 - fVar71;
      auVar74._0_4_ =
           (fVar101 * (fVar58 + fVar78) - (fVar38 + fVar72) * fVar171) * fVar14 +
           ((fVar94 + fVar170) * fVar171 - (fVar58 + fVar78) * fVar133) * fVar10 +
           (fVar133 * (fVar38 + fVar72) - (fVar94 + fVar170) * fVar101) * local_1a28;
      auVar74._4_4_ =
           (fVar107 * (fVar69 + fVar85) - (fVar55 + fVar75) * fVar173) * fVar15 +
           ((fVar97 + fVar172) * fVar173 - (fVar69 + fVar85) * fVar138) * fVar11 +
           (fVar138 * (fVar55 + fVar75) - (fVar97 + fVar172) * fVar107) * fStack_1a24;
      auVar74._8_4_ =
           (fVar109 * (fVar70 + fVar88) - (fVar56 + fVar76) * fVar175) * fVar16 +
           ((fVar98 + fVar174) * fVar175 - (fVar70 + fVar88) * fVar141) * fVar12 +
           (fVar141 * (fVar56 + fVar76) - (fVar98 + fVar174) * fVar109) * fStack_1a20;
      auVar74._12_4_ =
           (fVar111 * (fVar71 + fVar91) - (fVar57 + fVar77) * fVar176) * fVar17 +
           ((fVar99 + fVar160) * fVar176 - (fVar71 + fVar91) * fVar143) * fVar13 +
           (fVar143 * (fVar57 + fVar77) - (fVar99 + fVar160) * fVar111) * fVar9;
      fVar57 = fVar118 + fVar153 + auVar74._0_4_;
      fVar71 = fVar123 + fVar156 + auVar74._4_4_;
      fVar94 = auVar121._8_4_ + fVar159 + auVar74._8_4_;
      fVar97 = auVar121._12_4_ + fVar162 + auVar74._12_4_;
      auVar47._8_4_ = auVar121._8_4_;
      auVar47._0_8_ = auVar121._0_8_;
      auVar47._12_4_ = auVar121._12_4_;
      auVar7._4_4_ = fVar156;
      auVar7._0_4_ = fVar153;
      auVar7._8_4_ = fVar159;
      auVar7._12_4_ = fVar162;
      auVar48 = minps(auVar47,auVar7);
      auVar48 = minps(auVar48,auVar74);
      auVar164._8_4_ = auVar121._8_4_;
      auVar164._0_8_ = auVar121._0_8_;
      auVar164._12_4_ = auVar121._12_4_;
      auVar8._4_4_ = fVar156;
      auVar8._0_4_ = fVar153;
      auVar8._8_4_ = fVar159;
      auVar8._12_4_ = fVar162;
      auVar165 = maxps(auVar164,auVar8);
      auVar165 = maxps(auVar165,auVar74);
      fVar160 = ABS(fVar57) * 1.1920929e-07;
      fVar77 = ABS(fVar71) * 1.1920929e-07;
      fVar91 = ABS(fVar94) * 1.1920929e-07;
      fVar99 = ABS(fVar97) * 1.1920929e-07;
      auVar64._0_8_ = CONCAT44(fVar77,fVar160) ^ 0x8000000080000000;
      auVar64._8_4_ = -fVar91;
      auVar64._12_4_ = -fVar99;
      auVar166._0_8_ =
           CONCAT44(-(uint)(auVar165._4_4_ <= fVar77 || -fVar77 <= auVar48._4_4_) & auVar59._4_4_,
                    -(uint)(auVar165._0_4_ <= fVar160 || -fVar160 <= auVar48._0_4_) & auVar59._0_4_)
      ;
      auVar166._8_4_ =
           -(uint)(auVar165._8_4_ <= fVar91 || auVar64._8_4_ <= auVar48._8_4_) & auVar59._8_4_;
      auVar166._12_4_ =
           -(uint)(auVar165._12_4_ <= fVar99 || auVar64._12_4_ <= auVar48._12_4_) & auVar59._12_4_;
      iVar22 = movmskps((int)v,auVar166);
      uVar136 = (uint)DAT_01f46710;
      uVar139 = DAT_01f46710._4_4_;
      uVar142 = DAT_01f46710._8_4_;
      uVar112 = DAT_01f46710._12_4_;
      if (iVar22 == 0) {
        auVar117._8_4_ = auVar166._8_4_;
        auVar117._0_8_ = auVar166._0_8_;
        auVar117._12_4_ = auVar166._12_4_;
      }
      else {
        auVar96._0_4_ = fVar163 * fVar100 - fVar126 * fVar152;
        auVar96._4_4_ = fVar167 * fVar106 - fVar129 * fVar155;
        auVar96._8_4_ = fVar168 * fVar108 - fVar130 * fVar158;
        auVar96._12_4_ = fVar169 * fVar110 - fVar131 * fVar161;
        auVar127._0_4_ = fVar126 * fVar171 - fVar101 * fVar100;
        auVar127._4_4_ = fVar129 * fVar173 - fVar107 * fVar106;
        auVar127._8_4_ = fVar130 * fVar175 - fVar109 * fVar108;
        auVar127._12_4_ = fVar131 * fVar176 - fVar111 * fVar110;
        auVar49._4_4_ =
             -(uint)((float)((uint)(fVar129 * fVar155) & uVar139) <
                    (float)((uint)(fVar107 * fVar106) & uVar139));
        auVar49._0_4_ =
             -(uint)((float)((uint)(fVar126 * fVar152) & uVar136) <
                    (float)((uint)(fVar101 * fVar100) & uVar136));
        auVar49._8_4_ =
             -(uint)((float)((uint)(fVar130 * fVar158) & uVar142) <
                    (float)((uint)(fVar109 * fVar108) & uVar142));
        auVar49._12_4_ =
             -(uint)((float)((uint)(fVar131 * fVar161) & uVar112) <
                    (float)((uint)(fVar111 * fVar110) & uVar112));
        auVar128 = blendvps(auVar127,auVar96,auVar49);
        auVar125._0_4_ = fVar152 * fVar80 - fVar79 * fVar100;
        auVar125._4_4_ = fVar155 * fVar87 - fVar86 * fVar106;
        auVar125._8_4_ = fVar158 * fVar90 - fVar89 * fVar108;
        auVar125._12_4_ = fVar161 * fVar93 - fVar92 * fVar110;
        auVar134._0_4_ = fVar133 * fVar100 - fVar80 * fVar171;
        auVar134._4_4_ = fVar138 * fVar106 - fVar87 * fVar173;
        auVar134._8_4_ = fVar141 * fVar108 - fVar90 * fVar175;
        auVar134._12_4_ = fVar143 * fVar110 - fVar93 * fVar176;
        auVar50._4_4_ =
             -(uint)((float)((uint)(fVar86 * fVar106) & uVar139) <
                    (float)((uint)(fVar87 * fVar173) & uVar139));
        auVar50._0_4_ =
             -(uint)((float)((uint)(fVar79 * fVar100) & uVar136) <
                    (float)((uint)(fVar80 * fVar171) & uVar136));
        auVar50._8_4_ =
             -(uint)((float)((uint)(fVar89 * fVar108) & uVar142) <
                    (float)((uint)(fVar90 * fVar175) & uVar142));
        auVar50._12_4_ =
             -(uint)((float)((uint)(fVar92 * fVar110) & uVar112) <
                    (float)((uint)(fVar93 * fVar176) & uVar112));
        auVar135 = blendvps(auVar134,auVar125,auVar50);
        auVar122._0_4_ = fVar79 * fVar126 - fVar80 * fVar163;
        auVar122._4_4_ = fVar86 * fVar129 - fVar87 * fVar167;
        auVar122._8_4_ = fVar89 * fVar130 - fVar90 * fVar168;
        auVar122._12_4_ = fVar92 * fVar131 - fVar93 * fVar169;
        auVar83._0_4_ = fVar80 * fVar101 - fVar133 * fVar126;
        auVar83._4_4_ = fVar87 * fVar107 - fVar138 * fVar129;
        auVar83._8_4_ = fVar90 * fVar109 - fVar141 * fVar130;
        auVar83._12_4_ = fVar93 * fVar111 - fVar143 * fVar131;
        auVar51._4_4_ =
             -(uint)((float)((uint)(fVar87 * fVar167) & uVar139) <
                    (float)((uint)(fVar138 * fVar129) & uVar139));
        auVar51._0_4_ =
             -(uint)((float)((uint)(fVar80 * fVar163) & uVar136) <
                    (float)((uint)(fVar133 * fVar126) & uVar136));
        auVar51._8_4_ =
             -(uint)((float)((uint)(fVar90 * fVar168) & uVar142) <
                    (float)((uint)(fVar141 * fVar130) & uVar142));
        auVar51._12_4_ =
             -(uint)((float)((uint)(fVar93 * fVar169) & uVar112) <
                    (float)((uint)(fVar143 * fVar131) & uVar112));
        auVar165 = blendvps(auVar83,auVar122,auVar51);
        fVar160 = fVar14 * auVar128._0_4_ + fVar10 * auVar135._0_4_ + local_1a28 * auVar165._0_4_;
        fVar77 = fVar15 * auVar128._4_4_ + fVar11 * auVar135._4_4_ + fStack_1a24 * auVar165._4_4_;
        fVar91 = fVar16 * auVar128._8_4_ + fVar12 * auVar135._8_4_ + fStack_1a20 * auVar165._8_4_;
        fVar99 = fVar17 * auVar128._12_4_ + fVar13 * auVar135._12_4_ + fVar9 * auVar165._12_4_;
        auVar115._0_4_ = fVar160 + fVar160;
        auVar115._4_4_ = fVar77 + fVar77;
        auVar115._8_4_ = fVar91 + fVar91;
        auVar115._12_4_ = fVar99 + fVar99;
        auVar65._0_4_ = fVar145 * auVar165._0_4_;
        auVar65._4_4_ = fVar147 * auVar165._4_4_;
        auVar65._8_4_ = fVar149 * auVar165._8_4_;
        auVar65._12_4_ = fVar157 * auVar165._12_4_;
        fVar77 = fVar177 * auVar128._0_4_ + fVar132 * auVar135._0_4_ + auVar65._0_4_;
        fVar91 = fVar178 * auVar128._4_4_ + fVar137 * auVar135._4_4_ + auVar65._4_4_;
        fVar99 = fVar179 * auVar128._8_4_ + fVar140 * auVar135._8_4_ + auVar65._8_4_;
        fVar98 = fVar151 * auVar128._12_4_ + fVar154 * auVar135._12_4_ + auVar65._12_4_;
        auVar48 = rcpps(auVar65,auVar115);
        fVar151 = auVar48._0_4_;
        fVar154 = auVar48._4_4_;
        fVar157 = auVar48._8_4_;
        fVar160 = auVar48._12_4_;
        fVar151 = ((1.0 - auVar115._0_4_ * fVar151) * fVar151 + fVar151) * (fVar77 + fVar77);
        fVar154 = ((1.0 - auVar115._4_4_ * fVar154) * fVar154 + fVar154) * (fVar91 + fVar91);
        fVar157 = ((1.0 - auVar115._8_4_ * fVar157) * fVar157 + fVar157) * (fVar99 + fVar99);
        fVar160 = ((1.0 - auVar115._12_4_ * fVar160) * fVar160 + fVar160) * (fVar98 + fVar98);
        auVar64._4_4_ = -(uint)(*(float *)(ray + 0x34) <= fVar154);
        auVar64._0_4_ = -(uint)(*(float *)(ray + 0x30) <= fVar151);
        auVar64._8_4_ = (float)-(uint)(*(float *)(ray + 0x38) <= fVar157);
        auVar64._12_4_ = (float)-(uint)(*(float *)(ray + 0x3c) <= fVar160);
        auVar116._0_4_ =
             (int)((uint)(auVar115._0_4_ != 0.0 &&
                         (fVar151 <= *(float *)(ray + 0x80) && *(float *)(ray + 0x30) <= fVar151)) *
                  -0x80000000) >> 0x1f;
        auVar116._4_4_ =
             (int)((uint)(auVar115._4_4_ != 0.0 &&
                         (fVar154 <= *(float *)(ray + 0x84) && *(float *)(ray + 0x34) <= fVar154)) *
                  -0x80000000) >> 0x1f;
        auVar116._8_4_ =
             (int)((uint)(auVar115._8_4_ != 0.0 &&
                         (fVar157 <= *(float *)(ray + 0x88) && *(float *)(ray + 0x38) <= fVar157)) *
                  -0x80000000) >> 0x1f;
        auVar116._12_4_ =
             (int)((uint)(auVar115._12_4_ != 0.0 &&
                         (fVar160 <= *(float *)(ray + 0x8c) && *(float *)(ray + 0x3c) <= fVar160)) *
                  -0x80000000) >> 0x1f;
        auVar117 = auVar116 & auVar166;
        iVar22 = movmskps(iVar22,auVar117);
        if (iVar22 != 0) {
          uStack_1840 = auVar121._8_8_;
          uStack_1880 = uStack_1840;
          local_1898 = CONCAT44(fVar156,fVar153);
          uStack_1890 = CONCAT44(fVar162,fVar159);
          auVar64._4_4_ = fVar71;
          auVar64._0_4_ = fVar57;
          auVar64._8_4_ = fVar94;
          auVar64._12_4_ = fVar97;
          local_18e8 = auVar165;
          local_18d8 = auVar135;
          local_18c8 = auVar128;
          local_18b8 = fVar151;
          fStack_18b4 = fVar154;
          fStack_18b0 = fVar157;
          fStack_18ac = fVar160;
          local_18a8 = auVar64;
          local_1888 = auVar121._0_8_;
        }
      }
      uVar1 = *(uint *)((long)&local_17d8 + lVar28 * 4);
      pRVar4 = (context->scene->geometries).items;
      pGVar5 = pRVar4[uVar1].ptr;
      uVar2 = pGVar5->mask;
      auVar104._0_4_ = -(uint)((uVar2 & *(uint *)(ray + 0x90)) == 0);
      auVar104._4_4_ = -(uint)((uVar2 & *(uint *)(ray + 0x94)) == 0);
      auVar104._8_4_ = -(uint)((uVar2 & *(uint *)(ray + 0x98)) == 0);
      auVar104._12_4_ = -(uint)((uVar2 & *(uint *)(ray + 0x9c)) == 0);
      auVar105 = ~auVar104 & auVar117;
      iVar22 = movmskps((int)pRVar4,auVar105);
      if (iVar22 == 0) {
        uVar21 = 0;
      }
      else {
        uVar21 = *(undefined4 *)((long)&local_17e8 + lVar28 * 4);
        pRVar25 = context->args;
        if ((pRVar25->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar48 = rcpps(auVar64,local_18a8);
          fVar151 = auVar48._0_4_;
          fVar154 = auVar48._4_4_;
          fVar157 = auVar48._8_4_;
          fVar160 = auVar48._12_4_;
          fVar151 = (float)(-(uint)(1e-18 <= (float)((uint)local_18a8._0_4_ & uVar136)) &
                           (uint)(((float)DAT_01f46a60 - local_18a8._0_4_ * fVar151) * fVar151 +
                                 fVar151));
          fVar154 = (float)(-(uint)(1e-18 <= (float)((uint)local_18a8._4_4_ & uVar139)) &
                           (uint)((DAT_01f46a60._4_4_ - local_18a8._4_4_ * fVar154) * fVar154 +
                                 fVar154));
          fVar157 = (float)(-(uint)(1e-18 <= (float)((uint)local_18a8._8_4_ & uVar142)) &
                           (uint)((DAT_01f46a60._8_4_ - local_18a8._8_4_ * fVar157) * fVar157 +
                                 fVar157));
          fVar160 = (float)(-(uint)(1e-18 <= (float)((uint)local_18a8._12_4_ & uVar112)) &
                           (uint)((DAT_01f46a60._12_4_ - local_18a8._12_4_ * fVar160) * fVar160 +
                                 fVar160));
          auVar66._0_4_ = (float)local_1888 * fVar151;
          auVar66._4_4_ = local_1888._4_4_ * fVar154;
          auVar66._8_4_ = (float)uStack_1880 * fVar157;
          auVar66._12_4_ = uStack_1880._4_4_ * fVar160;
          local_1778 = minps(auVar66,_DAT_01f46a60);
          auVar52._0_4_ = fVar151 * (float)local_1898;
          auVar52._4_4_ = fVar154 * local_1898._4_4_;
          auVar52._8_4_ = fVar157 * (float)uStack_1890;
          auVar52._12_4_ = fVar160 * uStack_1890._4_4_;
          local_1788 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)minps(auVar52,_DAT_01f46a60);
          local_17c8._0_8_ = local_18c8._0_8_;
          local_17c8._8_8_ = local_18c8._8_8_;
          local_17c8._16_8_ = local_18d8._0_8_;
          local_17c8._24_8_ = local_18d8._8_8_;
          local_17c8._32_8_ = local_18e8._0_8_;
          local_17c8._40_8_ = local_18e8._8_8_;
          local_1798 = CONCAT44(fStack_18b4,local_18b8);
          uStack_1790 = CONCAT44(fStack_18ac,fStack_18b0);
          args.valid = (int *)&Ng;
          args.geometryUserPtr = &t;
          args.context = (RTCRayQueryContext *)&v_1;
          args.ray = (RTCRayN *)&u;
          std::
          _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
          ::
          _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                    ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                      *)&args,(_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                               *)&local_17c8.field_0);
          local_17c8._0_8_ = Ng.field_0._0_8_;
          local_17c8._8_8_ = Ng.field_0._8_8_;
          local_17c8._16_8_ = Ng.field_0._16_8_;
          local_17c8._24_8_ = Ng.field_0._24_8_;
          local_17c8._32_8_ = Ng.field_0._32_8_;
          local_17c8._40_8_ = Ng.field_0._40_8_;
          local_1798 = u.field_0._0_8_;
          uStack_1790 = u.field_0._8_8_;
          local_1788 = v_1.field_0;
          local_1778._4_4_ = uVar21;
          local_1778._0_4_ = uVar21;
          local_1778._8_4_ = uVar21;
          local_1778._12_4_ = uVar21;
          local_1768 = uVar1;
          uStack_1764 = uVar1;
          uStack_1760 = uVar1;
          uStack_175c = uVar1;
          local_1758 = context->user->instID[0];
          uStack_1754 = local_1758;
          uStack_1750 = local_1758;
          uStack_174c = local_1758;
          local_1748 = context->user->instPrimID[0];
          uStack_1744 = local_1748;
          uStack_1740 = local_1748;
          uStack_173c = local_1748;
          auVar48 = *(undefined1 (*) [16])(ray + 0x80);
          auVar165 = blendvps(auVar48,(undefined1  [16])t.field_0,auVar105);
          *(undefined1 (*) [16])(ray + 0x80) = auVar165;
          args.valid = (int *)local_1a08;
          args.geometryUserPtr = pGVar5->userPtr;
          args.context = context->user;
          args.hit = (RTCHitN *)&local_17c8;
          args.N = 4;
          pRVar25 = (RTCIntersectArguments *)pGVar5->occlusionFilterN;
          args.ray = (RTCRayN *)ray;
          local_1a08 = auVar105;
          if (pRVar25 != (RTCIntersectArguments *)0x0) {
            pRVar25 = (RTCIntersectArguments *)(*(code *)pRVar25)(&args);
          }
          if (local_1a08 == (undefined1  [16])0x0) {
            auVar67._8_4_ = 0xffffffff;
            auVar67._0_8_ = 0xffffffffffffffff;
            auVar67._12_4_ = 0xffffffff;
            auVar67 = auVar67 ^ _DAT_01f46b70;
          }
          else {
            p_Var6 = context->args->filter;
            if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var6)(&args);
            }
            auVar53._0_4_ = -(uint)(local_1a08._0_4_ == 0);
            auVar53._4_4_ = -(uint)(local_1a08._4_4_ == 0);
            auVar53._8_4_ = -(uint)(local_1a08._8_4_ == 0);
            auVar53._12_4_ = -(uint)(local_1a08._12_4_ == 0);
            auVar67 = auVar53 ^ _DAT_01f46b70;
            auVar165 = blendvps(_DAT_01f45a40,*(undefined1 (*) [16])(args.ray + 0x80),auVar53);
            *(undefined1 (*) [16])(args.ray + 0x80) = auVar165;
            pRVar25 = (RTCIntersectArguments *)args.ray;
          }
          auVar68._0_4_ = auVar67._0_4_ << 0x1f;
          auVar68._4_4_ = auVar67._4_4_ << 0x1f;
          auVar68._8_4_ = auVar67._8_4_ << 0x1f;
          auVar68._12_4_ = auVar67._12_4_ << 0x1f;
          auVar105._0_4_ = auVar68._0_4_ >> 0x1f;
          auVar105._4_4_ = auVar68._4_4_ >> 0x1f;
          auVar105._8_4_ = auVar68._8_4_ >> 0x1f;
          auVar105._12_4_ = auVar68._12_4_ >> 0x1f;
          auVar48 = blendvps(auVar48,*(undefined1 (*) [16])(ray + 0x80),auVar68);
          *(undefined1 (*) [16])(ray + 0x80) = auVar48;
        }
        uVar21 = SUB84(pRVar25,0);
        auVar59 = ~auVar105 & auVar59;
      }
      fVar160 = INFINITY;
      fVar157 = INFINITY;
      fVar154 = INFINITY;
      fVar151 = INFINITY;
      uVar136 = movmskps(uVar21,auVar59);
      pSVar24 = (Scene *)(ulong)uVar136;
      lVar28 = lVar28 + 1;
    } while (uVar136 != 0);
    uVar21 = 0;
LAB_006c1449:
    auVar113 = auVar113 & auVar59;
    iVar22 = movmskps(uVar21,auVar113);
    p_Var27 = local_19e0 + 1;
    lVar36 = lVar36 + 0x50;
    p_Var26 = p_Var27;
  } while (iVar22 != 0);
  pIVar33 = (Intersectors *)&args;
  auVar84._0_8_ = auVar113._0_8_ ^ 0xffffffffffffffff;
  auVar84._8_4_ = auVar113._8_4_ ^ 0xffffffff;
  auVar84._12_4_ = auVar113._12_4_ ^ 0xffffffff;
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       (auVar84 | (undefined1  [16])terminated.field_0);
  uVar136 = movmskps((int)p_Var27,(undefined1  [16])terminated.field_0);
  uVar23 = (ulong)uVar136;
  if (uVar136 == 0xf) goto LAB_006c1570;
  tray.tfar.field_0 =
       (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
       blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01f45a40,
                (undefined1  [16])terminated.field_0);
  goto LAB_006c07fc;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }